

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O3

void __thiscall
duckdb::CompressedMaterializationInfo::CompressedMaterializationInfo
          (CompressedMaterializationInfo *this,LogicalOperator *op,
          vector<unsigned_long,_true> *child_idxs_p,column_binding_set_t *referenced_bindings)

{
  size_type *psVar1;
  pointer puVar2;
  reference this_00;
  type __args;
  unsigned_long *child_idx;
  size_type *psVar3;
  
  (this->binding_map)._M_h._M_buckets = &(this->binding_map)._M_h._M_single_bucket;
  (this->binding_map)._M_h._M_bucket_count = 1;
  (this->binding_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->binding_map)._M_h._M_element_count = 0;
  (this->binding_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->binding_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->binding_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar2 = (child_idxs_p->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (child_idxs_p->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar2;
  (this->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (child_idxs_p->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (child_idxs_p->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (child_idxs_p->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (child_idxs_p->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->child_info).super_vector<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>.
  super__Vector_base<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->child_info).super_vector<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>.
  super__Vector_base<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->child_info).super_vector<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>.
  super__Vector_base<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>::reserve
            (&(this->child_info).
              super_vector<duckdb::CMChildInfo,_std::allocator<duckdb::CMChildInfo>_>,
             (long)(this->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  psVar3 = (this->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (this->child_idxs).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&op->children,*psVar3);
      __args = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(this_00);
      ::std::vector<duckdb::CMChildInfo,std::allocator<duckdb::CMChildInfo>>::
      emplace_back<duckdb::LogicalOperator&,std::unordered_set<duckdb::ColumnBinding,duckdb::ColumnBindingHashFunction,duckdb::ColumnBindingEquality,std::allocator<duckdb::ColumnBinding>>const&>
                ((vector<duckdb::CMChildInfo,std::allocator<duckdb::CMChildInfo>> *)
                 &this->child_info,__args,referenced_bindings);
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  return;
}

Assistant:

CompressedMaterializationInfo::CompressedMaterializationInfo(LogicalOperator &op, vector<idx_t> &&child_idxs_p,
                                                             const column_binding_set_t &referenced_bindings)
    : child_idxs(std::move(child_idxs_p)) {
	child_info.reserve(child_idxs.size());
	for (const auto &child_idx : child_idxs) {
		child_info.emplace_back(*op.children[child_idx], referenced_bindings);
	}
}